

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

void Z80::OpCode_POPone(Z80Reg r16)

{
  Z80Reg local_10 [4];
  
  local_10[2] = 0xffffffff;
  local_10[0] = Z80_UNK;
  local_10[1] = Z80_UNK;
  if (r16 < Z80_AF) {
    if (r16 == Z80_BC) {
      local_10[0] = 0xc1;
      local_10[1] = Z80_UNK;
    }
    else if (r16 == Z80_DE) {
      local_10[0] = 0xd1;
      local_10[1] = Z80_UNK;
    }
    else if (r16 == Z80_HL) {
      local_10[0] = 0xe1;
      local_10[1] = Z80_UNK;
    }
  }
  else if ((r16 == Z80_IY) || (r16 == Z80_IX)) {
    local_10[1] = 0xe1;
    local_10[0] = r16;
  }
  else if (r16 == Z80_AF) {
    local_10[0] = 0xf1;
    local_10[1] = Z80_UNK;
  }
  EmitBytes(local_10,true);
  return;
}

Assistant:

static void OpCode_POPone(const Z80Reg r16) {
		int e[] { -1, -1, -1 };
		switch (r16) {
		case Z80_AF:
			e[0] = 0xf1; break;
		case Z80_BC:
			e[0] = 0xc1; break;
		case Z80_DE:
			e[0] = 0xd1; break;
		case Z80_HL:
			e[0] = 0xe1; break;
		case Z80_IX:
		case Z80_IY:
			e[0] = r16; e[1] = 0xe1; break;
		default:
			break;
		}
		EmitBytes(e, true);
	}